

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void compareUnits(UnitsPtr *u1,UnitsPtr *u2,EntityPtr *expectedParent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  EntityPtr *local_38;
  
  libcellml::Entity::id_abi_cxx11_();
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_88,"u1->id()","u2->id()",&local_58,&local_78);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x156,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
  }
  local_38 = expectedParent;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = libcellml::Units::isBaseUnit();
  local_78._M_dataplus._M_p._0_1_ = uVar4;
  local_88[0] = (internal)libcellml::Units::isBaseUnit();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_58,"u1->isBaseUnit()","u2->isBaseUnit()",(bool *)&local_78,
             (bool *)local_88);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x157,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
      local_78._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = libcellml::ImportedEntity::isImport();
  local_78._M_dataplus._M_p._0_1_ = uVar4;
  local_88[0] = (internal)libcellml::ImportedEntity::isImport();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_58,"u1->isImport()","u2->isImport()",(bool *)&local_78,
             (bool *)local_88);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x158,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
      local_78._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_88,"u1->importReference()","u2->importReference()",&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x159,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::NamedEntity::name_abi_cxx11_();
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_88,"u1->name()","u2->name()",&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x15a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ParentedEntity::parent();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Entity>,std::shared_ptr<libcellml::ParentedEntity>>
            ((internal *)&local_58,"expectedParent","u2->parent()",local_38,
             (shared_ptr<libcellml::ParentedEntity> *)&local_78);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
  }
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x15b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
      local_78._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  compareUnit(u1,u2);
  return;
}

Assistant:

void compareUnits(const libcellml::UnitsPtr &u1, const libcellml::UnitsPtr &u2, const libcellml::EntityPtr &expectedParent)
{
    EXPECT_EQ(u1->id(), u2->id());
    EXPECT_EQ(u1->isBaseUnit(), u2->isBaseUnit());
    EXPECT_EQ(u1->isImport(), u2->isImport());
    EXPECT_EQ(u1->importReference(), u2->importReference());
    EXPECT_EQ(u1->name(), u2->name());
    EXPECT_EQ(expectedParent, u2->parent());

    compareUnit(u1, u2);
}